

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O2

int AF_A_MageAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  AActor *pAVar4;
  AActor *actor;
  char *__assertion;
  FSoundID local_34;
  DAngle local_30;
  DAngle local_28;
  DAngle local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005421fd;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor == (AActor *)0x0) {
LAB_005420c7:
        actor = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005421fd;
        }
      }
      if (numparam == 1) goto LAB_00542147;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_005421ed;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005421fd;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_005421ed;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00542147:
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)&actor->target);
        if (pAVar4 != (AActor *)0x0) {
          dVar1 = (actor->Angles).Yaw.Degrees;
          local_20.Degrees = dVar1;
          MStaffSpawn2(actor,&local_20);
          local_28.Degrees = dVar1 + -5.0;
          MStaffSpawn2(actor,&local_28);
          local_30.Degrees = dVar1 + 5.0;
          MStaffSpawn2(actor,&local_30);
          local_34.ID = S_FindSound("MageStaffFire");
          S_Sound(actor,1,&local_34,1.0,1.0);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005421fd;
    }
    if (actor == (AActor *)0x0) goto LAB_005420c7;
  }
LAB_005421ed:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005421fd:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MageAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
	{
		return 0;
	}
	DAngle angle = self->Angles.Yaw;
	MStaffSpawn2(self, angle);
	MStaffSpawn2(self, angle - 5);
	MStaffSpawn2(self, angle + 5);
	S_Sound(self, CHAN_WEAPON, "MageStaffFire", 1, ATTN_NORM);
	return 0;
}